

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdlib.c
# Opt level: O1

CrispyValue std_list_append(CrispyValue *value,Vm *vm)

{
  ObjString *object;
  CrispyValue value_00;
  CrispyValue CVar1;
  
  if ((value->type == OBJECT) && ((((ObjList *)(value->field_1).o_value)->object).type == OBJ_LIST))
  {
    value_00._4_4_ = 0;
    value_00.type = value[1].type;
    value_00.field_1.p_value = value[1].field_1.p_value;
    list_append((ObjList *)(value->field_1).o_value,value_00);
    CVar1._4_4_ = 0;
    CVar1.type = value->type;
    CVar1.field_1.p_value = (value->field_1).p_value;
  }
  else {
    vm->err_flag = true;
    object = new_string(vm,"You can only append to list",0x1b);
    CVar1 = create_object(&object->object);
  }
  return CVar1;
}

Assistant:

CrispyValue std_list_append(CrispyValue *value, Vm *vm) {
    if (value->type != OBJECT || value->o_value->type != OBJ_LIST) {
        vm->err_flag = true;
        return create_object((Object *) new_string(vm, "You can only append to list", 27));
    }

    ObjList *list = (ObjList *) value->o_value;
    list_append(list, value[1]);
    return value[0];
}